

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

bool __thiscall BackwardPass::ProcessDef(BackwardPass *this,Opnd *opnd)

{
  BasicBlock *pBVar1;
  Instr *instr;
  Region *region;
  GlobOpt *this_00;
  StackSym **ppSVar2;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  code *pcVar3;
  OpndKind OVar4;
  OpndKind OVar5;
  bool bVar6;
  BOOLEAN BVar7;
  BOOLEAN BVar8;
  bool bVar9;
  bool bVar10;
  RegSlot RVar11;
  BailOutKind BVar12;
  undefined4 *puVar13;
  BackwardPass *pBVar14;
  PropertySymOpnd *pPVar15;
  Func *pFVar16;
  RegOpnd *pRVar17;
  Phase PVar18;
  uint uVar19;
  char *this_02;
  BackwardPass *this_03;
  byte bVar20;
  
  OVar4 = IR::Opnd::GetKind(opnd);
  OVar5 = IR::Opnd::GetKind(opnd);
  if (OVar4 == OpndKindReg) {
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar6) goto LAB_003df3a4;
      *puVar13 = 0;
    }
    this_03 = (BackwardPass *)opnd[1]._vptr_Opnd;
    bVar20 = opnd->field_0xb;
    if (((this->isCollectionPass == false) &&
        (InvalidateCloneStrCandidate(this,opnd), this->tag == BackwardPhase)) &&
       (this->currentPrePassLoop != (Loop *)0x0)) {
      pBVar14 = (BackwardPass *)this->currentPrePassLoop->symsAssignedToInLoop;
      BVar7 = BVSparse<Memory::JitArenaAllocator>::TestAndSet
                        ((BVSparse<Memory::JitArenaAllocator> *)pBVar14,
                         *(BVIndex *)&this_03->tempAlloc);
      bVar6 = InstrPreservesNumberValues(pBVar14,this->currentInstr,(Sym *)this_03);
      if (BVar7 == '\0') {
        if (bVar6) {
          BVSparse<Memory::JitArenaAllocator>::Set
                    (this->currentPrePassLoop->preservesNumberValue,*(BVIndex *)&this_03->tempAlloc)
          ;
        }
      }
      else if (!bVar6) {
        BVSparse<Memory::JitArenaAllocator>::Clear
                  (this->currentPrePassLoop->preservesNumberValue,*(BVIndex *)&this_03->tempAlloc);
      }
    }
  }
  else {
    OVar4 = IR::Opnd::GetKind(opnd);
    if (OVar5 != OpndKindSym) {
      if (OVar4 != OpndKindIndir) {
        return false;
      }
      ProcessUse(this,opnd);
      return false;
    }
    if (OVar4 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar6) goto LAB_003df3a4;
      *puVar13 = 0;
    }
    this_03 = (BackwardPass *)opnd[1]._vptr_Opnd;
    bVar20 = opnd->field_0xb;
  }
  pBVar1 = this->currentBlock;
  instr = this->currentInstr;
  if ((instr->m_kind == InstrKindByteCodeUses) && (instr->m_opcode == ByteCodeUses)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1e81,"(!instr->IsByteCodeUsesInstr())","!instr->IsByteCodeUsesInstr()");
    if (!bVar6) goto LAB_003df3a4;
    *puVar13 = 0;
  }
  if (*(char *)((long)&this_03->tempAlloc + 4) != '\x02') {
    if ((instr->m_kind == InstrKindByteCodeUses) && (instr->m_opcode == ByteCodeUses)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1ea7,"(!instr->IsByteCodeUsesInstr())","!instr->IsByteCodeUsesInstr()");
      if (!bVar6) goto LAB_003df3a4;
      *puVar13 = 0;
    }
    this_02 = (char *)this;
    bVar9 = DoByteCodeUpwardExposedUsed(this);
    bVar6 = true;
    if (bVar9) {
      if (*(char *)((long)&this_03->tempAlloc + 4) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        this_02 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
        ;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar9) goto LAB_003df3a4;
        *puVar13 = 0;
      }
      uVar19 = *(uint *)&this_03->tag;
      if ((uVar19 >> 0xd & 1) != 0) {
        if (*(char *)((long)&this_03->tempAlloc + 4) != '\x01') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar13 = 1;
          this_02 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
          ;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar6) goto LAB_003df3a4;
          *puVar13 = 0;
          uVar19 = *(uint *)&this_03->tag;
        }
        pBVar14 = this_03;
        if ((uVar19 >> 0x10 & 1) != 0) {
          this_02 = (char *)this_03;
          pBVar14 = (BackwardPass *)StackSym::GetVarEquivSym((StackSym *)this_03,(Func *)0x0);
        }
        region = this->currentRegion;
        if (region == (Region *)0x0) {
          bVar6 = true;
          bVar9 = true;
        }
        else {
          if (*(char *)((long)&this_03->tempAlloc + 4) != '\x01') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar13 = 1;
            this_02 = 
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
            ;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                               ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
            if (!bVar6) goto LAB_003df3a4;
            *puVar13 = 0;
          }
          bVar6 = CheckWriteThroughSymInRegion((BackwardPass *)this_02,region,(StackSym *)this_03);
          bVar9 = CheckWriteThroughSymInRegion
                            ((BackwardPass *)this_02,this->currentRegion,(StackSym *)pBVar14);
          bVar9 = !bVar9;
          bVar6 = !bVar6;
        }
        if ((bVar20 & 8) == 0) {
          pFVar16 = this->func;
          if (*(char *)((long)&this_03->tempAlloc + 4) != '\x01') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar13 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
            if (!bVar10) goto LAB_003df3a4;
            *puVar13 = 0;
          }
          bVar10 = DoDeadStore(pFVar16,(StackSym *)this_03);
          if ((!bVar10) && (OVar4 = IR::Opnd::GetKind(opnd), OVar4 == OpndKindReg)) {
            pRVar17 = IR::Opnd::AsRegOpnd(opnd);
            pRVar17->field_0x18 = pRVar17->field_0x18 | 4;
          }
          if (bVar9) {
            BVSparse<Memory::JitArenaAllocator>::Clear
                      (pBVar1->byteCodeUpwardExposedUsed,*(BVIndex *)&pBVar14->tempAlloc);
            pFVar16 = StackSym::GetByteCodeFunc((StackSym *)pBVar14);
            if (pFVar16 == this->func) {
              ppSVar2 = pBVar1->byteCodeRestoreSyms;
              RVar11 = StackSym::GetByteCodeRegSlot((StackSym *)pBVar14);
              ppSVar2[RVar11] = (StackSym *)0x0;
            }
          }
        }
      }
    }
    if (this->isCollectionPass != false) {
      return false;
    }
    OVar4 = IR::Opnd::GetKind(opnd);
    if (OVar4 == OpndKindReg) {
      if (*(char *)((long)&this_03->tempAlloc + 4) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar9) goto LAB_003df3a4;
        *puVar13 = 0;
      }
      MarkTemp(this,(StackSym *)this_03);
    }
    if ((((this->tag == BackwardPhase) && (instr->m_opcode == Ld_A)) &&
        (OVar4 = IR::Opnd::GetKind(instr->m_src1), OVar4 == OpndKindReg)) &&
       (BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                          (pBVar1->upwardExposedFields,*(BVIndex *)&this_03->tempAlloc),
       BVar7 != '\0')) {
      this_01 = pBVar1->upwardExposedFields;
      pRVar17 = IR::Opnd::AsRegOpnd(instr->m_src1);
      BVSparse<Memory::JitArenaAllocator>::Set(this_01,(pRVar17->m_sym->super_Sym).m_id);
    }
    if (!bVar6) {
      return false;
    }
    BVar7 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                      (pBVar1->upwardExposedUses,*(BVIndex *)&this_03->tempAlloc);
    goto LAB_003df2c7;
  }
  ProcessStackSymUse(this,(StackSym *)this_03->currentPrePassLoop,(bVar20 & 8) >> 3);
  if (this->isCollectionPass != false) {
    return false;
  }
  bVar6 = DoDeadStoreSlots(this);
  BVar7 = true;
  if (((bVar6) && ((byte)(*(char *)((long)&this_03->tempAlloc + 5) - 1U) < 2)) &&
     (BVar8 = BVSparse<Memory::JitArenaAllocator>::TestAndSet
                        (pBVar1->slotDeadStoreCandidates,*(BVIndex *)&this_03->tempAlloc),
     BVar8 != '\0')) {
    BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                      (pBVar1->upwardExposedUses,*(BVIndex *)&this_03->tempAlloc);
    if (BVar7 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1e91,
                         "(isPropertySymUsed || !block->upwardExposedUses->Test(propertySym->m_id))"
                         ,"isPropertySymUsed || !block->upwardExposedUses->Test(propertySym->m_id)")
      ;
      if (!bVar6) goto LAB_003df3a4;
      *puVar13 = 0;
    }
    BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                      (pBVar1->upwardExposedUses,*(BVIndex *)&this_03->currentPrePassLoop->topFunc);
    BVar7 = BVar7 != '\0';
  }
  BVar8 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                    (pBVar1->upwardExposedFields,*(BVIndex *)&this_03->tempAlloc);
  PVar18 = this->tag;
  if (PVar18 == BackwardPhase && BVar8 == '\0') {
    if (this->currentPrePassLoop == (Loop *)0x0) {
      opnd->field_0xb = opnd->field_0xb | 4;
    }
LAB_003defc0:
    PVar18 = this->tag;
  }
  else if (PVar18 == DeadStorePhase) {
    opnd->field_0xb = opnd->field_0xb & 0xfb | (BVar8 == '\0') << 2;
    goto LAB_003defc0;
  }
  if (PVar18 == BackwardPhase) {
    OVar4 = IR::Opnd::GetKind(opnd);
    if (OVar4 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar6) goto LAB_003df3a4;
      *puVar13 = 0;
    }
    bVar6 = IR::SymOpnd::IsPropertySymOpnd((SymOpnd *)opnd);
    if (bVar6) {
      this_00 = this->globOpt;
      pPVar15 = IR::Opnd::AsPropertySymOpnd(opnd);
      GlobOpt::PreparePropertySymOpndForTypeCheckSeq(this_00,pPVar15,instr,this->currentBlock->loop)
      ;
    }
  }
  OVar4 = IR::Opnd::GetKind(opnd);
  if (OVar4 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar6) {
LAB_003df3a4:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar13 = 0;
  }
  bVar6 = IR::SymOpnd::IsPropertySymOpnd((SymOpnd *)opnd);
  if (bVar6) {
    pPVar15 = IR::Opnd::AsPropertySymOpnd(opnd);
    ProcessPropertySymOpndUse(this,pPVar15);
  }
LAB_003df2c7:
  if (BVar7 != '\0') {
    return false;
  }
  if (this->tag != DeadStorePhase) {
    return false;
  }
  bVar6 = DoDeadStore(this->func);
  if (bVar6) {
    bVar6 = IR::Instr::HasAnySideEffects(instr);
    if (bVar6) {
      uVar19 = instr->m_opcode - 0x70;
      if (8 < uVar19) {
        return false;
      }
      if ((0x145U >> (uVar19 & 0x1f) & 1) == 0) {
        return false;
      }
    }
    if (((this->currentPrePassLoop == (Loop *)0x0) &&
        ((OVar4 = IR::Opnd::GetKind(opnd), OVar4 != OpndKindReg ||
         (pRVar17 = IR::Opnd::AsRegOpnd(opnd), (pRVar17->field_0x18 & 4) == 0)))) &&
       (((instr->field_0x38 & 0x10) == 0 ||
        ((BVar12 = IR::Instr::GetBailOutKind(instr),
         (BVar12 & BailOutOnResultConditions) == BailOutInvalid &&
         ((uVar19 = (BVar12 & ~BailOutKindBits) - BailOutIntOnly, 0x1e < uVar19 ||
          ((0x78e00027U >> (uVar19 & 0x1f) & 1) == 0)))))))) {
      DeadStoreInstr(this,instr);
      return true;
    }
  }
  return false;
}

Assistant:

bool
BackwardPass::ProcessDef(IR::Opnd * opnd)
{
    BOOLEAN isJITOptimizedReg = false;
    Sym * sym;
    if (opnd->IsRegOpnd())
    {
        sym = opnd->AsRegOpnd()->m_sym;
        isJITOptimizedReg = opnd->GetIsJITOptimizedReg();
        if (!IsCollectionPass())
        {
            this->InvalidateCloneStrCandidate(opnd);
            if ((tag == Js::BackwardPhase) && IsPrePass())
            {
                bool firstDef = !this->currentPrePassLoop->symsAssignedToInLoop->TestAndSet(sym->m_id);

                if (firstDef)
                {
                    if (this->InstrPreservesNumberValues(this->currentInstr, sym))
                    {
                        this->currentPrePassLoop->preservesNumberValue->Set(sym->m_id);
                    }
                }
                else if (!this->InstrPreservesNumberValues(this->currentInstr, sym))
                {
                    this->currentPrePassLoop->preservesNumberValue->Clear(sym->m_id);
                }
            }
        }
    }
    else if (opnd->IsSymOpnd())
    {
        sym = opnd->AsSymOpnd()->m_sym;
        isJITOptimizedReg = opnd->GetIsJITOptimizedReg();
    }
    else
    {
        if (opnd->IsIndirOpnd())
        {
            this->ProcessUse(opnd);
        }
        return false;
    }

    BasicBlock * block = this->currentBlock;
    BOOLEAN isUsed = true;
    BOOLEAN keepSymLiveForException = false;
    BOOLEAN keepVarSymLiveForException = false;
    IR::Instr * instr = this->currentInstr;
    Assert(!instr->IsByteCodeUsesInstr());
    if (sym->IsPropertySym())
    {
        PropertySym *propertySym = sym->AsPropertySym();
        ProcessStackSymUse(propertySym->m_stackSym, isJITOptimizedReg);

        if (IsCollectionPass())
        {
            return false;
        }

        if (this->DoDeadStoreSlots())
        {
            if (propertySym->m_fieldKind == PropertyKindLocalSlots || propertySym->m_fieldKind == PropertyKindSlots)
            {
                BOOLEAN isPropertySymUsed = !block->slotDeadStoreCandidates->TestAndSet(propertySym->m_id);
                Assert(isPropertySymUsed || !block->upwardExposedUses->Test(propertySym->m_id));

                isUsed = isPropertySymUsed || block->upwardExposedUses->Test(propertySym->m_stackSym->m_id);
            }
        }

        this->DoSetDead(opnd, !block->upwardExposedFields->TestAndClear(propertySym->m_id));

        if (tag == Js::BackwardPhase)
        {
            if (opnd->AsSymOpnd()->IsPropertySymOpnd())
            {
                this->globOpt->PreparePropertySymOpndForTypeCheckSeq(opnd->AsPropertySymOpnd(), instr, this->currentBlock->loop);
            }
        }
        if (opnd->AsSymOpnd()->IsPropertySymOpnd())
        {
            this->ProcessPropertySymOpndUse(opnd->AsPropertySymOpnd());
        }
    }
    else
    {
        Assert(!instr->IsByteCodeUsesInstr());

        if (this->DoByteCodeUpwardExposedUsed())
        {
            if (sym->AsStackSym()->HasByteCodeRegSlot())
            {
                StackSym * varSym = sym->AsStackSym();
                if (varSym->IsTypeSpec())
                {
                    // It has to have a var version for byte code regs
                    varSym = varSym->GetVarEquivSym(nullptr);
                }

                if (this->currentRegion)
                {
                    keepSymLiveForException = this->CheckWriteThroughSymInRegion(this->currentRegion, sym->AsStackSym());
                    keepVarSymLiveForException = this->CheckWriteThroughSymInRegion(this->currentRegion, varSym);
                }

                if (!isJITOptimizedReg)
                {
                    if (!DoDeadStore(this->func, sym->AsStackSym()))
                    {
                        // Don't deadstore the bytecodereg sym, so that we could do write to get the locals inspection
                        if (opnd->IsRegOpnd())
                        {
                            opnd->AsRegOpnd()->m_dontDeadStore = true;
                        }
                    }

                    // write through symbols should not be cleared from the byteCodeUpwardExposedUsed BV upon defs in the Try region:
                    //      try
                    //          x =
                    //          <bailout> <-- this bailout should restore x from its first def. This would not happen if x is cleared
                    //                        from byteCodeUpwardExposedUsed when we process its second def
                    //          <exception>
                    //          x =
                    //      catch
                    //          = x
                    if (!keepVarSymLiveForException)
                    {
                        // Always track the sym use on the var sym.
                        block->byteCodeUpwardExposedUsed->Clear(varSym->m_id);
#if DBG
                        // TODO: We can only track first level function stack syms right now
                        if (varSym->GetByteCodeFunc() == this->func)
                        {
                            block->byteCodeRestoreSyms[varSym->GetByteCodeRegSlot()] = nullptr;
                        }
#endif
                    }
                }
            }
        }

        if (IsCollectionPass())
        {
            return false;
        }

        // Don't care about property sym for mark temps
        if (opnd->IsRegOpnd())
        {
            this->MarkTemp(sym->AsStackSym());
        }

        if (this->tag == Js::BackwardPhase &&
            instr->m_opcode == Js::OpCode::Ld_A &&
            instr->GetSrc1()->IsRegOpnd() &&
            block->upwardExposedFields->Test(sym->m_id))
        {
            block->upwardExposedFields->Set(instr->GetSrc1()->AsRegOpnd()->m_sym->m_id);
        }

        if (!keepSymLiveForException)
        {
            isUsed = block->upwardExposedUses->TestAndClear(sym->m_id);
        }
    }

    if (isUsed || !this->DoDeadStore())
    {
        return false;
    }

    // FromVar on a primitive value has no side-effects
    // TODO: There may be more cases where FromVars can be dead-stored, such as cases where they have a bailout that would bail
    // out on non-primitive vars, thereby causing no side effects anyway. However, it needs to be ensured that no assumptions
    // that depend on the bailout are made later in the function.

    // Special case StFld for trackable fields
    bool hasSideEffects = instr->HasAnySideEffects()
        && instr->m_opcode != Js::OpCode::StFld
        && instr->m_opcode != Js::OpCode::StRootFld
        && instr->m_opcode != Js::OpCode::StFldStrict
        && instr->m_opcode != Js::OpCode::StRootFldStrict;

    if (this->IsPrePass() || hasSideEffects)
    {
        return false;
    }

    if (opnd->IsRegOpnd() && opnd->AsRegOpnd()->m_dontDeadStore)
    {
        return false;
    }

    if (instr->HasBailOutInfo())
    {
        // A bailout inserted for aggressive or lossy int type specialization causes assumptions to be made on the value of
        // the instruction's destination later on, as though the bailout did not happen. If the value is an int constant and
        // that value is propagated forward, it can cause the bailout instruction to become a dead store and be removed,
        // thereby invalidating the assumptions made. Or for lossy int type specialization, the lossy conversion to int32
        // may have side effects and so cannot be dead-store-removed. As one way of solving that problem, bailout
        // instructions resulting from aggressive or lossy int type spec are not dead-stored.
        const auto bailOutKind = instr->GetBailOutKind();
        if(bailOutKind & IR::BailOutOnResultConditions)
        {
            return false;
        }
        switch(bailOutKind & ~IR::BailOutKindBits)
        {
            case IR::BailOutIntOnly:
            case IR::BailOutNumberOnly:
            case IR::BailOutExpectingInteger:
            case IR::BailOutPrimitiveButString:
            case IR::BailOutExpectingString:
            case IR::BailOutOnNotPrimitive:
            case IR::BailOutFailedInlineTypeCheck:
            case IR::BailOutOnFloor:
            case IR::BailOnModByPowerOf2:
            case IR::BailOnDivResultNotInt:
            case IR::BailOnIntMin:
                return false;
        }
    }

    // Dead store
    DeadStoreInstr(instr);
    return true;
}